

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O0

void __thiscall
amrex::StateData::InterpFillFab
          (StateData *this,MultiFabCopyDescriptor *multiFabCopyDesc,
          Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_> *mfid,
          Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_> *fillBoxIds,FArrayBox *dest,
          Real time,int src_comp,int dest_comp,int num_comp,bool extrap)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  TimeCenter TVar4;
  FabArrayId *pFVar5;
  long in_RDI;
  StateDescriptor *this_00;
  FabArrayId in_R9D;
  double in_XMM0_Qa;
  Real RVar6;
  FArrayBox *destFab;
  Real teps;
  FArrayBox *in_stack_000000b0;
  Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_> *in_stack_000000b8;
  undefined4 in_stack_000000c4;
  MultiFabId in_stack_000000cc;
  int in_stack_000000e0;
  int in_stack_000000e8;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 uVar8;
  undefined2 in_stack_ffffffffffffff50;
  undefined2 uVar9;
  undefined2 in_stack_ffffffffffffff52;
  undefined4 in_stack_ffffffffffffff54;
  char *in_stack_ffffffffffffff60;
  FArrayBox *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar10;
  
  this_00 = *(StateDescriptor **)(in_RDI + 8);
  TVar4 = StateDescriptor::timeType(this_00);
  if (TVar4 == Point) {
    bVar3 = std::operator==((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                            CONCAT44(in_stack_ffffffffffffff54,
                                     CONCAT22(in_stack_ffffffffffffff52,in_stack_ffffffffffffff50)),
                            (nullptr_t)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                           );
    if (bVar3) {
      pFVar5 = Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>::operator[]
                         ((Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_> *)
                          CONCAT44(in_stack_ffffffffffffff54,
                                   CONCAT22(in_stack_ffffffffffffff52,in_stack_ffffffffffffff50)),
                          CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      iVar10 = pFVar5->fabArrayId;
      Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>::operator[]
                ((Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_> *)
                 CONCAT44(in_stack_ffffffffffffff54,
                          CONCAT22(in_stack_ffffffffffffff52,in_stack_ffffffffffffff50)),
                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      FabArrayCopyDescriptor<amrex::FArrayBox>::FillFab
                ((FabArrayCopyDescriptor<amrex::FArrayBox> *)
                 CONCAT44(iVar10,in_stack_ffffffffffffffb8),in_R9D,
                 (FillBoxId *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffa8);
    }
    else {
      Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>::operator[]
                ((Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_> *)
                 CONCAT44(in_stack_ffffffffffffff54,
                          CONCAT22(in_stack_ffffffffffffff52,in_stack_ffffffffffffff50)),
                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>::operator[]
                ((Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_> *)
                 CONCAT44(in_stack_ffffffffffffff54,
                          CONCAT22(in_stack_ffffffffffffff52,in_stack_ffffffffffffff50)),
                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      amrex::InterpFillFab
                ((MultiFabCopyDescriptor *)CONCAT44(in_stack_000000c4,dest_comp),in_stack_000000b8,
                 in_stack_000000cc,(MultiFabId)num_comp,in_stack_000000b0,(Real)this,
                 (Real)multiFabCopyDesc,(Real)mfid,fillBoxIds._4_4_,in_stack_000000e0,
                 in_stack_000000e8,fillBoxIds._3_1_);
    }
  }
  else {
    dVar1 = *(double *)(in_RDI + 0xa8);
    dVar2 = *(double *)(in_RDI + 0xb8);
    uVar7 = SUB104(_DAT_016afc00,0);
    uVar8 = (undefined4)((unkuint10)_DAT_016afc00 >> 0x20);
    uVar9 = (undefined2)((unkuint10)_DAT_016afc00 >> 0x40);
    RVar6 = literals::operator____rt((literals *)this_00,_DAT_016afc00);
    destFab = (FArrayBox *)((dVar1 - dVar2) * RVar6);
    if ((in_XMM0_Qa <= *(double *)(in_RDI + 0xa8) - (double)destFab) ||
       (*(double *)(in_RDI + 0xb0) + (double)destFab <= in_XMM0_Qa)) {
      bVar3 = std::operator!=((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                              CONCAT44(in_stack_ffffffffffffff54,
                                       CONCAT22(in_stack_ffffffffffffff52,uVar9)),
                              (nullptr_t)CONCAT44(uVar8,uVar7));
      if ((!bVar3) ||
         ((in_XMM0_Qa <= *(double *)(in_RDI + 0xb8) - (double)destFab ||
          (*(double *)(in_RDI + 0xc0) + (double)destFab <= in_XMM0_Qa)))) {
        Error_host(in_stack_ffffffffffffff60);
      }
      else {
        Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>::operator[]
                  ((Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_> *)
                   CONCAT44(in_stack_ffffffffffffff54,CONCAT22(in_stack_ffffffffffffff52,uVar9)),
                   CONCAT44(uVar8,uVar7));
        Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>::operator[]
                  ((Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_> *)
                   CONCAT44(in_stack_ffffffffffffff54,CONCAT22(in_stack_ffffffffffffff52,uVar9)),
                   CONCAT44(uVar8,uVar7));
        FabArrayCopyDescriptor<amrex::FArrayBox>::FillFab
                  ((FabArrayCopyDescriptor<amrex::FArrayBox> *)
                   CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),in_R9D,
                   (FillBoxId *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   destFab);
      }
    }
    else {
      Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>::operator[]
                ((Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_> *)
                 CONCAT44(in_stack_ffffffffffffff54,CONCAT22(in_stack_ffffffffffffff52,uVar9)),
                 CONCAT44(uVar8,uVar7));
      Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>::operator[]
                ((Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_> *)
                 CONCAT44(in_stack_ffffffffffffff54,CONCAT22(in_stack_ffffffffffffff52,uVar9)),
                 CONCAT44(uVar8,uVar7));
      FabArrayCopyDescriptor<amrex::FArrayBox>::FillFab
                ((FabArrayCopyDescriptor<amrex::FArrayBox> *)
                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),in_R9D,
                 (FillBoxId *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),destFab)
      ;
    }
  }
  return;
}

Assistant:

void
StateData::InterpFillFab (MultiFabCopyDescriptor&  multiFabCopyDesc,
                          const Vector<MultiFabId>& mfid,
                          const Vector<FillBoxId>&  fillBoxIds,
                          FArrayBox&               dest,
                          Real                     time,
                          int                      src_comp,
                          int                      dest_comp,
                          int                      num_comp,
                          bool                     extrap)
{
    BL_PROFILE("StateData::InterpFillFab()");
    if (desc->timeType() == StateDescriptor::Point)
    {
        if (old_data == nullptr)
        {
            multiFabCopyDesc.FillFab(mfid[MFNEWDATA], fillBoxIds[0], dest);
        }
        else
        {
            amrex::InterpFillFab(multiFabCopyDesc,
                                 fillBoxIds,
                                 mfid[MFOLDDATA],
                                 mfid[MFNEWDATA],
                                 dest,
                                 old_time.start,
                                 new_time.start,
                                 time,
                                 src_comp,
                                 dest_comp,
                                 num_comp,
                                 extrap);
        }
    }
    else
    {
        const Real teps = (new_time.start - old_time.start)*1.e-3_rt;

        if (time > new_time.start-teps && time < new_time.stop+teps)
        {
            multiFabCopyDesc.FillFab(mfid[MFNEWDATA], fillBoxIds[0], dest);
        }
        else if (old_data != nullptr        &&
                 time > old_time.start-teps &&
                 time < old_time.stop+teps)
        {
            multiFabCopyDesc.FillFab(mfid[MFOLDDATA], fillBoxIds[0], dest);
        }
        else
        {
            amrex::Error("StateData::Interp(): cannot interp");
        }
    }
}